

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleCacheEntry(cmSetPropertyCommand *this,string *cacheKey)

{
  string *propertyName;
  char *__s;
  cmState *this_00;
  allocator<char> local_49;
  string local_48;
  
  propertyName = &this->PropertyName;
  __s = (this->PropertyValue)._M_dataplus._M_p;
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  if (this->Remove == true) {
    cmState::RemoveCacheEntryProperty(this_00,cacheKey,propertyName);
  }
  if (this->AppendMode == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    cmState::AppendCacheEntryProperty(this_00,cacheKey,propertyName,&local_48,this->AppendAsString);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    cmState::SetCacheEntryProperty(this_00,cacheKey,propertyName,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheEntry(std::string const& cacheKey)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  cmState* state = this->Makefile->GetState();
  if (this->Remove) {
    state->RemoveCacheEntryProperty(cacheKey, name);
  }
  if (this->AppendMode) {
    state->AppendCacheEntryProperty(cacheKey, name, value,
                                    this->AppendAsString);
  } else {
    state->SetCacheEntryProperty(cacheKey, name, value);
  }

  return true;
}